

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::setup(ShadersOOB *this)

{
  bool bVar1;
  ShaderType SVar2;
  Functions *gl;
  GLuint *pGVar3;
  pointer puVar4;
  GLenum GVar5;
  GLint GVar6;
  GLenum GVar7;
  ostream *poVar8;
  ProgramSources *pPVar9;
  TestError *pTVar10;
  char *pcVar11;
  string *this_00;
  int bufNdx;
  long lVar12;
  long lVar13;
  undefined1 auStack_818 [40];
  string local_7f0;
  string local_7d0;
  string local_7b0;
  undefined1 local_790 [40];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> refValues;
  string readWriteStatement;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  ProgramSources local_100;
  
  gl = (this->super_ContextReset).m_gl;
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderDecl);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
    std::operator<<((ostream *)&shaderDecl,"uniform highp int u_index;\n");
    poVar8 = std::operator<<((ostream *)&shaderBody,
                             "\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n");
    std::operator<<(poVar8,
                    "\tuint groupNdx = size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n")
    ;
    if (this->m_isLocalArray == true) {
      bVar1 = this->m_isRead;
      poVar8 = std::operator<<((ostream *)&shaderBody,
                               "\thighp vec4 values = vec4(1.0f) * float(groupNdx);\n");
      pcVar11 = "\tsb_out.values[u_index] = values.x;\n";
      if (bVar1 != false) {
        pcVar11 = "\tsb_out.values.x = values[u_index];\n";
      }
      std::operator<<(poVar8,pcVar11);
    }
    else {
      pcVar11 = "sb_in";
      if (this->m_isUBO != false) {
        pcVar11 = "ub_in";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&refValues,pcVar11,(allocator<char> *)&readWriteStatement);
      poVar8 = std::operator<<((ostream *)&shaderDecl,"layout(std140, binding = 1) ");
      pcVar11 = "buffer";
      if (this->m_isUBO != false) {
        pcVar11 = "uniform";
      }
      poVar8 = std::operator<<(poVar8,pcVar11);
      poVar8 = std::operator<<(poVar8," Input\n");
      poVar8 = std::operator<<(poVar8,"{\n");
      poVar8 = std::operator<<(poVar8,"\thighp vec4 values;\n");
      poVar8 = std::operator<<(poVar8,"} ");
      poVar8 = std::operator<<(poVar8,(string *)&refValues);
      poVar8 = std::operator<<(poVar8,"[");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
      std::operator<<(poVar8,"];\n");
      if (this->m_isRead == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_818,"\tsb_out.values.x = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &refValues);
        std::operator+(&readWriteStatement,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_818,"[0].values[u_index] * float(groupNdx);\n");
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_818,"\tsb_out.values[u_index] = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &refValues);
        std::operator+(&readWriteStatement,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_818,"[0].values.x * float(groupNdx);\n");
      }
      std::__cxx11::string::~string((string *)auStack_818);
      std::operator<<((ostream *)&shaderBody,(string *)&readWriteStatement);
      std::__cxx11::string::~string((string *)&readWriteStatement);
      std::__cxx11::string::~string((string *)&refValues);
    }
    memset(&readWriteStatement,0,0xac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&refValues);
    poVar8 = std::operator<<((ostream *)&refValues,"#version 310 es\n");
    poVar8 = std::operator<<(poVar8,"layout(local_size_x = 1, local_size_y = 1) in;\n");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"layout(binding = 0) buffer Output {\n");
    poVar8 = std::operator<<(poVar8,"\thighp vec4 values;\n");
    poVar8 = std::operator<<(poVar8,"} sb_out;\n");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,(string *)&local_7f0);
    poVar8 = std::operator<<(poVar8,"void main ()\n");
    poVar8 = std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<(poVar8,(string *)&local_7d0);
    std::operator<<(poVar8,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refValues);
    glu::ComputeSource::ComputeSource((ComputeSource *)auStack_818,(string *)local_790);
    pPVar9 = glu::ProgramSources::operator<<
                       ((ProgramSources *)&readWriteStatement,(ShaderSource *)auStack_818);
    glu::ProgramSources::ProgramSources(&local_100,pPVar9);
    std::__cxx11::string::~string((string *)(auStack_818 + 8));
    std::__cxx11::string::~string((string *)local_790);
    std::__cxx11::string::~string((string *)&local_7d0);
    this_00 = &local_7f0;
    goto LAB_002273bb;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  std::operator<<((ostream *)&shaderDecl,"uniform highp int u_index;\n");
  if (this->m_isLocalArray == true) {
    bVar1 = this->m_isRead;
    poVar8 = std::operator<<((ostream *)&shaderBody,"\thighp vec4 color_out = vec4(1.0f);\n");
    pcVar11 = "\tcolor[u_index] = color_out.x;\n";
    if (bVar1 != false) {
      pcVar11 = "\tcolor.x = color_out[u_index];\n";
    }
    std::operator<<(poVar8,pcVar11);
  }
  else {
    pcVar11 = "sb_in";
    if (this->m_isUBO != false) {
      pcVar11 = "ub_in";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refValues,pcVar11,(allocator<char> *)&readWriteStatement);
    poVar8 = std::operator<<((ostream *)&shaderDecl,"layout(std140, binding = 0) ");
    pcVar11 = "buffer";
    if (this->m_isUBO != false) {
      pcVar11 = "uniform";
    }
    poVar8 = std::operator<<(poVar8,pcVar11);
    poVar8 = std::operator<<(poVar8," Block\n");
    poVar8 = std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<(poVar8,"\thighp vec4 color_out;\n");
    poVar8 = std::operator<<(poVar8,"} ");
    poVar8 = std::operator<<(poVar8,(string *)&refValues);
    poVar8 = std::operator<<(poVar8,"[");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::operator<<(poVar8,"];\n");
    if (this->m_isRead == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_818,"\tcolor.x = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refValues
                    );
      std::operator+(&readWriteStatement,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_818,"[0].color_out[u_index];\n");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_818,"\tcolor[u_index] = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refValues
                    );
      std::operator+(&readWriteStatement,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_818,"[0].color_out.x;\n");
    }
    std::__cxx11::string::~string((string *)auStack_818);
    std::operator<<((ostream *)&shaderBody,(string *)&readWriteStatement);
    std::__cxx11::string::~string((string *)&readWriteStatement);
    std::__cxx11::string::~string((string *)&refValues);
  }
  memset(&readWriteStatement,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar2 = (this->super_ContextReset).m_shaderType;
  if (SVar2 == SHADERTYPE_VERT_AND_FRAG) {
LAB_00226dca:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&refValues);
    poVar8 = std::operator<<((ostream *)&refValues,"#version 310 es\n");
    poVar8 = std::operator<<(poVar8,"in highp vec4 a_position;\n");
    poVar8 = std::operator<<(poVar8,"out highp vec4 v_color;\n");
    poVar8 = std::operator<<(poVar8,(string *)&local_7d0);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"void main (void)\n");
    poVar8 = std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<(poVar8,"\thighp vec4 color;\n");
    poVar8 = std::operator<<(poVar8,local_728);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\tv_color = color;\n");
    poVar8 = std::operator<<(poVar8,"\tgl_Position = a_position;\n");
    std::operator<<(poVar8,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refValues);
  }
  else if (SVar2 == SHADERTYPE_FRAG) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,
               "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,(allocator<char> *)&refValues);
  }
  else {
    if (SVar2 == SHADERTYPE_VERT) goto LAB_00226dca;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"",(allocator<char> *)&refValues);
  }
  glu::VertexSource::VertexSource((VertexSource *)auStack_818,&local_7f0);
  pPVar9 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&readWriteStatement,(ShaderSource *)auStack_818);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar2 = (this->super_ContextReset).m_shaderType;
  if (SVar2 == SHADERTYPE_VERT_AND_FRAG) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&refValues);
    poVar8 = std::operator<<((ostream *)&refValues,"#version 310 es\n");
    poVar8 = std::operator<<(poVar8,"in highp vec4 v_color;\n");
    poVar8 = std::operator<<(poVar8,"layout(location = 0) out highp vec4 fragColor;\n");
    poVar8 = std::operator<<(poVar8,local_748);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"void main (void)\n");
    poVar8 = std::operator<<(poVar8,"{\n");
    poVar8 = std::operator<<(poVar8,"\thighp vec4 color = vec4(0.0f);\n");
    poVar8 = std::operator<<(poVar8,local_768);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\tfragColor = color;\n");
    std::operator<<(poVar8,"}\n");
    std::__cxx11::stringbuf::str();
LAB_0022730a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refValues);
  }
  else {
    if (SVar2 == SHADERTYPE_FRAG) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&refValues);
      poVar8 = std::operator<<((ostream *)&refValues,"#version 310 es\n");
      poVar8 = std::operator<<(poVar8,"layout(location = 0) out highp vec4 fragColor;\n");
      poVar8 = std::operator<<(poVar8,local_748);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"void main (void)\n");
      poVar8 = std::operator<<(poVar8,"{\n");
      poVar8 = std::operator<<(poVar8,"\thighp vec4 color = vec4(0.0f);\n");
      poVar8 = std::operator<<(poVar8,local_768);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\tfragColor = color;\n");
      std::operator<<(poVar8,"}\n");
      std::__cxx11::stringbuf::str();
      goto LAB_0022730a;
    }
    if (SVar2 == SHADERTYPE_VERT) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,
                 "#version 310 es\nin highp vec4 v_color;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
                 ,(allocator<char> *)&refValues);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,"",(allocator<char> *)&refValues);
    }
  }
  glu::FragmentSource::FragmentSource((FragmentSource *)local_790,&local_7b0);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)local_790);
  glu::ProgramSources::ProgramSources(&local_100,pPVar9);
  std::__cxx11::string::~string((string *)(local_790 + 8));
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_748);
  std::__cxx11::string::~string((string *)(auStack_818 + 8));
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string(local_728);
  this_00 = &local_7d0;
LAB_002273bb:
  std::__cxx11::string::~string((string *)this_00);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&readWriteStatement);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderDecl);
  glu::ShaderProgram::ShaderProgram(&program,gl,&local_100);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<((this->super_ContextReset).m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x50c);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(program.m_program.m_program);
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x50e);
  GVar6 = (*((this->super_ContextReset).m_gl)->getUniformLocation)
                    (program.m_program.m_program,"u_index");
  GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar5,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x511);
  if (GVar6 != -1) {
    (*((this->super_ContextReset).m_gl)->uniform1i)(GVar6,-1);
    GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar5,"uniform1i(indexLocation, index)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x515);
    if ((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) {
      refValues.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3f8000003f800000;
      refValues.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
      refValues.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0xbf8000003f800000;
      GVar6 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                        (program.m_program.m_program,"a_position");
      this->m_coordLocation = GVar6;
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x523);
      if (this->m_coordLocation == -1) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x524);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      this->m_coordinatesBuffer = 0;
      (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,"genBuffers(1, &m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x528);
      (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x529);
      (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,&refValues,0x88e4);
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,
                      "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52a);
      (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,"enableVertexAttribArray(m_coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52b);
      (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
                (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
      GVar5 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar5,
                      "vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52c);
    }
    _shaderDecl = 0x3f80000000000000;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&refValues,3,(value_type *)&shaderDecl,(allocator_type *)&shaderBody);
    GVar5 = 0x90d2;
    if (this->m_isUBO != false) {
      GVar5 = 0x8a11;
    }
    if (this->m_isLocalArray == false) {
      pGVar3 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (*((this->super_ContextReset).m_gl)->genBuffers)
                ((GLsizei)((ulong)((long)(this->m_buffers).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar3)
                          >> 2),pGVar3);
      GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar7,"genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x536);
      lVar13 = 0;
      for (lVar12 = 0;
          puVar4 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar12 < (int)((ulong)((long)(this->m_buffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >>
                        2); lVar12 = lVar12 + 1) {
        (*((this->super_ContextReset).m_gl)->bindBuffer)(GVar5,puVar4[lVar12]);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,"bindBuffer(resType, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53a);
        (*((this->super_ContextReset).m_gl)->bufferData)
                  (GVar5,0x10,
                   (void *)((long)(refValues.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13),
                   0x88e4);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,
                        "bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53b);
        (*((this->super_ContextReset).m_gl)->bindBufferBase)
                  (GVar5,(GLuint)lVar12,
                   (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12]);
        GVar7 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar7,"bindBufferBase(resType, bufNdx, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53c);
        lVar13 = lVar13 + 0x10;
      }
    }
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&refValues.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,(char *)0x0,"indexLocation != (glw::GLint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
             ,0x512);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShadersOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLint indexLocation = m_gl.getUniformLocation(program.getProgram(), "u_index");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(indexLocation != (glw::GLint)-1);

	const glw::GLint index = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(indexLocation, index));

	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		// Setup vertices position
		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	// Create dummy data for filling buffer objects
	const std::vector<tcu::Vec4> refValues(s_numBindings, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f));
	glw::GLenum resType = (m_isUBO) ? GL_UNIFORM_BUFFER : GL_SHADER_STORAGE_BUFFER;

	if (!m_isLocalArray)
	{
		// Set up interface block of buffer bindings
		GLU_CHECK_GLW_CALL(m_gl, genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));

		for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
		{
			GLU_CHECK_GLW_CALL(m_gl, bindBuffer(resType, m_buffers[bufNdx]));
			GLU_CHECK_GLW_CALL(m_gl, bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW));
			GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(resType, bufNdx, m_buffers[bufNdx]));
		}
	}
}